

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_context_get_device_info__alsa
                    (ma_context *pContext,ma_device_type deviceType,ma_device_id *pDeviceID,
                    ma_share_mode shareMode,ma_device_info *pDeviceInfo)

{
  uint uVar1;
  _func_void_ptr_size_t_void_ptr *p_Var2;
  _func_void_ptr_void_ptr_size_t_void_ptr *p_Var3;
  _func_void_void_ptr_void_ptr *p_Var4;
  ma_result mVar5;
  int iVar6;
  size_t sVar7;
  void *__s;
  void *__s_00;
  int sampleRateDir;
  ma_snd_pcm_t *pPCM;
  ma_context_get_device_info_enum_callback_data__alsa data;
  undefined4 local_64;
  ma_snd_pcm_t *local_60;
  ma_device_type local_58 [2];
  ma_device_id *local_50;
  ma_share_mode local_48;
  ma_device_info *local_40;
  int local_38;
  
  local_64 = 0;
  if (pContext == (ma_context *)0x0) {
    __assert_fail("pContext != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x420d,
                  "ma_result ma_context_get_device_info__alsa(ma_context *, ma_device_type, const ma_device_id *, ma_share_mode, ma_device_info *)"
                 );
  }
  local_38 = 0;
  local_58[0] = deviceType;
  local_50 = pDeviceID;
  local_48 = shareMode;
  local_40 = pDeviceInfo;
  mVar5 = ma_context_enumerate_devices__alsa
                    (pContext,ma_context_get_device_info_enum_callback__alsa,local_58);
  if (mVar5 != 0) {
    return mVar5;
  }
  if (local_38 == 0) {
    return -0x68;
  }
  mVar5 = ma_context_open_pcm__alsa(pContext,shareMode,deviceType,pDeviceID,&local_60);
  if (mVar5 != 0) {
    return mVar5;
  }
  sVar7 = (*(pContext->field_21).alsa.snd_pcm_hw_params_sizeof)();
  p_Var2 = (pContext->allocationCallbacks).onMalloc;
  if (p_Var2 == (_func_void_ptr_size_t_void_ptr *)0x0) {
    p_Var3 = (pContext->allocationCallbacks).onRealloc;
    if (p_Var3 == (_func_void_ptr_void_ptr_size_t_void_ptr *)0x0) {
      return -4;
    }
    __s = (*p_Var3)((void *)0x0,sVar7,(pContext->allocationCallbacks).pUserData);
  }
  else {
    __s = (*p_Var2)(sVar7,(pContext->allocationCallbacks).pUserData);
  }
  if (__s == (void *)0x0) {
    return -4;
  }
  memset(__s,0,sVar7);
  iVar6 = (*(pContext->field_21).alsa.snd_pcm_hw_params_any)(local_60);
  if (iVar6 < 0) {
    p_Var4 = (pContext->allocationCallbacks).onFree;
    if (p_Var4 != (_func_void_void_ptr_void_ptr *)0x0) {
      (*p_Var4)(__s,(pContext->allocationCallbacks).pUserData);
    }
    mVar5 = ma_result_from_errno(-iVar6);
    if (pContext->logCallback == (ma_log_proc)0x0) {
      return mVar5;
    }
    (*pContext->logCallback)
              (pContext,(ma_device *)0x0,1,
               "[ALSA] Failed to initialize hardware parameters. snd_pcm_hw_params_any() failed.");
    return mVar5;
  }
  (*(pContext->field_21).alsa.snd_pcm_hw_params_get_channels_min)(__s,&pDeviceInfo->minChannels);
  (*(pContext->field_21).alsa.snd_pcm_hw_params_get_channels_max)(__s,&pDeviceInfo->maxChannels);
  (*(pContext->field_21).alsa.snd_pcm_hw_params_get_rate_min)
            (__s,&pDeviceInfo->minSampleRate,&local_64);
  (*(pContext->field_21).alsa.snd_pcm_hw_params_get_rate_max)
            (__s,&pDeviceInfo->maxSampleRate,&local_64);
  sVar7 = (*(pContext->field_21).alsa.snd_pcm_format_mask_sizeof)();
  p_Var2 = (pContext->allocationCallbacks).onMalloc;
  if (p_Var2 == (_func_void_ptr_size_t_void_ptr *)0x0) {
    p_Var3 = (pContext->allocationCallbacks).onRealloc;
    if (p_Var3 == (_func_void_ptr_void_ptr_size_t_void_ptr *)0x0) goto LAB_0010696f;
    __s_00 = (*p_Var3)((void *)0x0,sVar7,(pContext->allocationCallbacks).pUserData);
  }
  else {
    __s_00 = (*p_Var2)(sVar7,(pContext->allocationCallbacks).pUserData);
  }
  if (__s_00 != (void *)0x0) {
    memset(__s_00,0,sVar7);
    (*(pContext->field_21).alsa.snd_pcm_hw_params_get_format_mask)(__s,__s_00);
    pDeviceInfo->formatCount = 0;
    iVar6 = (*(pContext->field_21).alsa.snd_pcm_format_mask_test)(__s_00,1);
    if (iVar6 != 0) {
      uVar1 = pDeviceInfo->formatCount;
      pDeviceInfo->formatCount = uVar1 + 1;
      pDeviceInfo->formats[uVar1] = ma_format_u8;
    }
    iVar6 = (*(pContext->field_21).alsa.snd_pcm_format_mask_test)(__s_00,2);
    if (iVar6 != 0) {
      uVar1 = pDeviceInfo->formatCount;
      pDeviceInfo->formatCount = uVar1 + 1;
      pDeviceInfo->formats[uVar1] = ma_format_s16;
    }
    iVar6 = (*(pContext->field_21).alsa.snd_pcm_format_mask_test)(__s_00,0x20);
    if (iVar6 != 0) {
      uVar1 = pDeviceInfo->formatCount;
      pDeviceInfo->formatCount = uVar1 + 1;
      pDeviceInfo->formats[uVar1] = ma_format_s24;
    }
    iVar6 = (*(pContext->field_21).alsa.snd_pcm_format_mask_test)(__s_00,10);
    if (iVar6 != 0) {
      uVar1 = pDeviceInfo->formatCount;
      pDeviceInfo->formatCount = uVar1 + 1;
      pDeviceInfo->formats[uVar1] = ma_format_s32;
    }
    iVar6 = (*(pContext->field_21).alsa.snd_pcm_format_mask_test)(__s_00,0xe);
    if (iVar6 != 0) {
      uVar1 = pDeviceInfo->formatCount;
      pDeviceInfo->formatCount = uVar1 + 1;
      pDeviceInfo->formats[uVar1] = ma_format_f32;
    }
    p_Var4 = (pContext->allocationCallbacks).onFree;
    if (p_Var4 != (_func_void_void_ptr_void_ptr *)0x0) {
      (*p_Var4)(__s_00,(pContext->allocationCallbacks).pUserData);
      p_Var4 = (pContext->allocationCallbacks).onFree;
      if (p_Var4 != (_func_void_void_ptr_void_ptr *)0x0) {
        (*p_Var4)(__s,(pContext->allocationCallbacks).pUserData);
      }
    }
    (*(pContext->field_21).alsa.snd_pcm_close)(local_60);
    return 0;
  }
LAB_0010696f:
  p_Var4 = (pContext->allocationCallbacks).onFree;
  if (p_Var4 != (_func_void_void_ptr_void_ptr *)0x0) {
    (*p_Var4)(__s,(pContext->allocationCallbacks).pUserData);
  }
  return -4;
}

Assistant:

static ma_result ma_context_get_device_info__alsa(ma_context* pContext, ma_device_type deviceType, const ma_device_id* pDeviceID, ma_share_mode shareMode, ma_device_info* pDeviceInfo)
{
    ma_context_get_device_info_enum_callback_data__alsa data;
    ma_result result;
    int resultALSA;
    ma_snd_pcm_t* pPCM;
    ma_snd_pcm_hw_params_t* pHWParams;
    ma_snd_pcm_format_mask_t* pFormatMask;
    int sampleRateDir = 0;

    MA_ASSERT(pContext != NULL);

    /* We just enumerate to find basic information about the device. */
    data.deviceType = deviceType;
    data.pDeviceID = pDeviceID;
    data.shareMode = shareMode;
    data.pDeviceInfo = pDeviceInfo;
    data.foundDevice = MA_FALSE;
    result = ma_context_enumerate_devices__alsa(pContext, ma_context_get_device_info_enum_callback__alsa, &data);
    if (result != MA_SUCCESS) {
        return result;
    }

    if (!data.foundDevice) {
        return MA_NO_DEVICE;
    }

    /* For detailed info we need to open the device. */
    result = ma_context_open_pcm__alsa(pContext, shareMode, deviceType, pDeviceID, &pPCM);
    if (result != MA_SUCCESS) {
        return result;
    }

    /* We need to initialize a HW parameters object in order to know what formats are supported. */
    pHWParams = (ma_snd_pcm_hw_params_t*)ma__calloc_from_callbacks(((ma_snd_pcm_hw_params_sizeof_proc)pContext->alsa.snd_pcm_hw_params_sizeof)(), &pContext->allocationCallbacks);
    if (pHWParams == NULL) {
        return MA_OUT_OF_MEMORY;
    }

    resultALSA = ((ma_snd_pcm_hw_params_any_proc)pContext->alsa.snd_pcm_hw_params_any)(pPCM, pHWParams);
    if (resultALSA < 0) {
        ma__free_from_callbacks(pHWParams, &pContext->allocationCallbacks);
        return ma_context_post_error(pContext, NULL, MA_LOG_LEVEL_ERROR, "[ALSA] Failed to initialize hardware parameters. snd_pcm_hw_params_any() failed.", ma_result_from_errno(-resultALSA));
    }

    ((ma_snd_pcm_hw_params_get_channels_min_proc)pContext->alsa.snd_pcm_hw_params_get_channels_min)(pHWParams, &pDeviceInfo->minChannels);
    ((ma_snd_pcm_hw_params_get_channels_max_proc)pContext->alsa.snd_pcm_hw_params_get_channels_max)(pHWParams, &pDeviceInfo->maxChannels);
    ((ma_snd_pcm_hw_params_get_rate_min_proc)pContext->alsa.snd_pcm_hw_params_get_rate_min)(pHWParams, &pDeviceInfo->minSampleRate, &sampleRateDir);
    ((ma_snd_pcm_hw_params_get_rate_max_proc)pContext->alsa.snd_pcm_hw_params_get_rate_max)(pHWParams, &pDeviceInfo->maxSampleRate, &sampleRateDir);

    /* Formats. */
    pFormatMask = (ma_snd_pcm_format_mask_t*)ma__calloc_from_callbacks(((ma_snd_pcm_format_mask_sizeof_proc)pContext->alsa.snd_pcm_format_mask_sizeof)(), &pContext->allocationCallbacks);
    if (pFormatMask == NULL) {
        ma__free_from_callbacks(pHWParams, &pContext->allocationCallbacks);
        return MA_OUT_OF_MEMORY;
    }

    ((ma_snd_pcm_hw_params_get_format_mask_proc)pContext->alsa.snd_pcm_hw_params_get_format_mask)(pHWParams, pFormatMask);

    pDeviceInfo->formatCount = 0;
    if (((ma_snd_pcm_format_mask_test_proc)pContext->alsa.snd_pcm_format_mask_test)(pFormatMask, MA_SND_PCM_FORMAT_U8)) {
        pDeviceInfo->formats[pDeviceInfo->formatCount++] = ma_format_u8;
    }
    if (((ma_snd_pcm_format_mask_test_proc)pContext->alsa.snd_pcm_format_mask_test)(pFormatMask, MA_SND_PCM_FORMAT_S16_LE)) {
        pDeviceInfo->formats[pDeviceInfo->formatCount++] = ma_format_s16;
    }
    if (((ma_snd_pcm_format_mask_test_proc)pContext->alsa.snd_pcm_format_mask_test)(pFormatMask, MA_SND_PCM_FORMAT_S24_3LE)) {
        pDeviceInfo->formats[pDeviceInfo->formatCount++] = ma_format_s24;
    }
    if (((ma_snd_pcm_format_mask_test_proc)pContext->alsa.snd_pcm_format_mask_test)(pFormatMask, MA_SND_PCM_FORMAT_S32_LE)) {
        pDeviceInfo->formats[pDeviceInfo->formatCount++] = ma_format_s32;
    }
    if (((ma_snd_pcm_format_mask_test_proc)pContext->alsa.snd_pcm_format_mask_test)(pFormatMask, MA_SND_PCM_FORMAT_FLOAT_LE)) {
        pDeviceInfo->formats[pDeviceInfo->formatCount++] = ma_format_f32;
    }

    ma__free_from_callbacks(pFormatMask, &pContext->allocationCallbacks);
    ma__free_from_callbacks(pHWParams, &pContext->allocationCallbacks);

    ((ma_snd_pcm_close_proc)pContext->alsa.snd_pcm_close)(pPCM);
    return MA_SUCCESS;
}